

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O0

Span<const_MILBlob::UInt3,_18446744073709551615UL> __thiscall
MILBlob::Blob::StorageReader::Impl::GetDataViewForSubByteSized<MILBlob::UInt3>
          (Impl *this,uint64_t offset)

{
  pointer this_00;
  runtime_error *prVar1;
  ulong uVar2;
  Span<const_unsigned_char,_18446744073709551615UL> SVar3;
  Span<const_MILBlob::UInt3,_18446744073709551615UL> SVar4;
  size_t numElements;
  size_t numBits;
  Util *pUStack_78;
  Span<const_unsigned_char,_18446744073709551615UL> rawSpan;
  blob_metadata metadata;
  uint64_t offset_local;
  Impl *this_local;
  
  GetAndCheckMetadata((blob_metadata *)&rawSpan.m_size,this,offset,UInt3);
  this_00 = std::
            unique_ptr<const_MILBlob::Blob::MMapFileReader,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
            ::operator->(&this->m_reader);
  SVar3 = MMapFileReader::ReadData(this_00,metadata.sizeInBytes,metadata._0_8_);
  if (7 < metadata.offset) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar1,"8 or more bits of padding for sub-byte sized data is incorrect");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = metadata._0_8_ * 8 - metadata.offset;
  if (uVar2 % 3 != 0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Invalid padding for blob");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pUStack_78 = (Util *)SVar3.m_ptr;
  rawSpan.m_ptr = (pointer)SVar3.m_size.m_size;
  SVar3.m_size.m_size = uVar2 / 3;
  SVar3.m_ptr = rawSpan.m_ptr;
  SVar4 = Util::CastToBitSpan<const_MILBlob::UInt3,_const_unsigned_char,_true>
                    (pUStack_78,SVar3,0xaaaaaaaaaaaaaaab);
  return SVar4;
}

Assistant:

Util::Span<const T> GetDataViewForSubByteSized(uint64_t offset) const
    {
        auto metadata = GetAndCheckMetadata(offset, BlobDataTypeTraits<T>::DataType);

        Util::Span<const uint8_t> rawSpan = m_reader->ReadData(metadata.offset, metadata.sizeInBytes);

        MILVerifyIsTrue(metadata.padding_size_in_bits < 8,
                        std::runtime_error,
                        "8 or more bits of padding for sub-byte sized data is incorrect");

        if constexpr (MILBlob::SubByteIsByteAligned<T>()) {
            MILVerifyIsTrue(metadata.padding_size_in_bits % T::SizeInBits == 0,
                            std::runtime_error,
                            "Invalid padding for byte-aligned sub-byte-sized type");
        }

        // metadata.sizeInBytes includes the padding to make the data byte aligned

        size_t numBits = metadata.sizeInBytes * 8;
        numBits -= metadata.padding_size_in_bits;
        MILVerifyIsTrue(numBits % T::SizeInBits == 0, std::runtime_error, "Invalid padding for blob");
        size_t numElements = numBits / T::SizeInBits;

        return Util::CastToBitSpan<const T>(rawSpan, numElements);
    }